

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int cmp_flatrange_addr(void *addr_,void *fr_)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  AddrRange r;
  AddrRange r_00;
  undefined1 b [16];
  undefined1 b_00 [16];
  _Bool _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 in_stack_ffffffffffffff58;
  FlatRange *fr;
  AddrRange *addr;
  void *fr__local;
  void *addr__local;
  
  uVar2 = *addr_;
  uVar3 = *(undefined8 *)*(undefined1 (*) [24])((long)addr_ + 8);
  uVar4 = *(undefined8 *)((long)addr_ + 0x10);
  uVar5 = *(undefined8 *)((long)addr_ + 0x18);
  r.size._8_8_ = in_stack_ffffffffffffff58;
  r._0_24_ = *(undefined1 (*) [24])((long)addr_ + 8);
  addrrange_end(r);
  a._8_8_ = uVar3;
  a._0_8_ = uVar2;
  b._8_8_ = uVar5;
  b._0_8_ = uVar4;
  _Var1 = int128_le((Int128)a,(Int128)b);
  if (_Var1) {
    addr__local._4_4_ = -1;
  }
  else {
    uVar2 = *(undefined8 *)((long)fr_ + 0x10);
    uVar3 = *(undefined8 *)*(undefined1 (*) [24])((long)fr_ + 0x18);
    uVar4 = *(undefined8 *)((long)fr_ + 0x20);
    uVar5 = *(undefined8 *)((long)fr_ + 0x28);
    r_00.size._8_8_ = *(undefined8 *)((long)addr_ + 8);
    r_00._0_24_ = *(undefined1 (*) [24])((long)fr_ + 0x18);
    addrrange_end(r_00);
    a_00._8_8_ = uVar3;
    a_00._0_8_ = uVar2;
    b_00._8_8_ = uVar5;
    b_00._0_8_ = uVar4;
    _Var1 = int128_ge((Int128)a_00,(Int128)b_00);
    if (_Var1) {
      addr__local._4_4_ = 1;
    }
    else {
      addr__local._4_4_ = 0;
    }
  }
  return addr__local._4_4_;
}

Assistant:

static int cmp_flatrange_addr(const void *addr_, const void *fr_)
{
    const AddrRange *addr = addr_;
    const FlatRange *fr = fr_;

    if (int128_le(addrrange_end(*addr), fr->addr.start)) {
        return -1;
    } else if (int128_ge(addr->start, addrrange_end(fr->addr))) {
        return 1;
    }
    return 0;
}